

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O2

void __thiscall CVmFile::write_str_short_prefix(CVmFile *this,char *str,size_t len)

{
  if (len < 0x10000) {
    write_uint2(this,(uint)len);
    write_bytes(this,str,len);
    return;
  }
  err_throw(0x66);
}

Assistant:

void write_str_short_prefix(const char *str, size_t len)
    {
        /* make sure it fits */
        if (len > 65535)
            err_throw(VMERR_WRITE_FILE);

        /* write the prefix and string */
        write_uint2((int)len);
        write_bytes(str, len);
    }